

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBailOut.cpp
# Opt level: O2

bool GlobOpt::IsTypeCheckProtected(Instr *instr)

{
  Opnd *this;
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  SymOpnd *pSVar3;
  undefined4 *puVar4;
  PropertySymOpnd *this_01;
  Opnd *pOVar5;
  
  pOVar5 = instr->m_dst;
  this = instr->m_src2;
  if (pOVar5 != (Opnd *)0x0) {
    this_00 = instr->m_src1;
    bVar2 = IR::Opnd::IsSymOpnd(pOVar5);
    if (bVar2) {
      pSVar3 = IR::Opnd::AsSymOpnd(pOVar5);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
      if ((this_00 != (Opnd *)0x0) && (bVar2)) {
        bVar2 = IR::Opnd::IsSymOpnd(this_00);
        if (bVar2) {
          pSVar3 = IR::Opnd::AsSymOpnd(this_00);
          bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
          if (bVar2) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
            *puVar4 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                               ,0x58b,
                               "(!dst || !dst->IsSymOpnd() || !dst->AsSymOpnd()->IsPropertySymOpnd() || !src1 || !src1->IsSymOpnd() || !src1->AsSymOpnd()->IsPropertySymOpnd())"
                               ,"No instruction should have a src1 and dst be a PropertySymOpnd.");
            if (!bVar2) goto LAB_004603e8;
            *puVar4 = 0;
          }
        }
      }
    }
  }
  if (this != (Opnd *)0x0) {
    bVar2 = IR::Opnd::IsSymOpnd(this);
    if (bVar2) {
      pSVar3 = IR::Opnd::AsSymOpnd(this);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
      if (bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBailOut.cpp"
                           ,0x58c,
                           "(!src2 || !src2->IsSymOpnd() || !src2->AsSymOpnd()->IsPropertySymOpnd())"
                           ,"No instruction should have a src2 be a PropertySymOpnd.");
        if (!bVar2) {
LAB_004603e8:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
  }
  pOVar5 = instr->m_dst;
  if (pOVar5 != (Opnd *)0x0) {
    bVar2 = IR::Opnd::IsSymOpnd(pOVar5);
    if (bVar2) {
      pSVar3 = IR::Opnd::AsSymOpnd(pOVar5);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
      if (bVar2) goto LAB_004603c5;
    }
  }
  pOVar5 = instr->m_src1;
  if (pOVar5 != (Opnd *)0x0) {
    bVar2 = IR::Opnd::IsSymOpnd(pOVar5);
    if (bVar2) {
      pSVar3 = IR::Opnd::AsSymOpnd(pOVar5);
      bVar2 = IR::SymOpnd::IsPropertySymOpnd(pSVar3);
      if (bVar2) {
LAB_004603c5:
        this_01 = IR::Opnd::AsPropertySymOpnd(pOVar5);
        bVar2 = IR::PropertySymOpnd::IsTypeCheckProtected(this_01);
        return bVar2;
      }
    }
  }
  return false;
}

Assistant:

bool
GlobOpt::IsTypeCheckProtected(const IR::Instr * instr)
{
#if DBG
    IR::Opnd* dst = instr->GetDst();
    IR::Opnd* src1 = instr->GetSrc1();
    IR::Opnd* src2 = instr->GetSrc2();
    AssertMsg(!dst || !dst->IsSymOpnd() || !dst->AsSymOpnd()->IsPropertySymOpnd() ||
        !src1 || !src1->IsSymOpnd() || !src1->AsSymOpnd()->IsPropertySymOpnd(), "No instruction should have a src1 and dst be a PropertySymOpnd.");
    AssertMsg(!src2 || !src2->IsSymOpnd() || !src2->AsSymOpnd()->IsPropertySymOpnd(), "No instruction should have a src2 be a PropertySymOpnd.");
#endif

    IR::Opnd * opnd = instr->GetDst();
    if (opnd && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return opnd->AsPropertySymOpnd()->IsTypeCheckProtected();
    }
    opnd = instr->GetSrc1();
    if (opnd && opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        return opnd->AsPropertySymOpnd()->IsTypeCheckProtected();
    }
    return false;
}